

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool __thiscall
libtorrent::torrent_info::resolve_duplicate_filenames
          (torrent_info *this,int max_duplicate_filenames,error_code *ec)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  bool bVar1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar2;
  uint32_t local_b8;
  int local_b4;
  uint32_t h;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_a4;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin1;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range1;
  undefined1 local_80 [8];
  string empty_str;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  files;
  error_code *ec_local;
  int max_duplicate_filenames_local;
  torrent_info *this_local;
  
  this_00 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)((long)&empty_str.field_2 + 8);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(this_00);
  ::std::__cxx11::string::string((string *)local_80);
  file_storage::all_path_hashes(&this->m_files,this_00);
  ___end1 = file_storage::file_range(&this->m_files);
  local_a4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      *)&__end1);
  rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
        end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             *)&__end1);
  do {
    i = local_a4.m_idx.m_val;
    h = (uint32_t)rhs;
    bVar1 = libtorrent::operator!=(local_a4,rhs);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_00735593:
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)((long)&empty_str.field_2 + 8));
      return this_local._7_1_;
    }
    local_b4 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                    ::operator*(&local_a4);
    local_b8 = file_storage::file_path_hash
                         (&this->m_files,(file_index_t)local_b4,(string *)local_80);
    pVar2 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)((long)&empty_str.field_2 + 8),&local_b8);
    if (((pVar2.second ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = resolve_duplicate_filenames_slow(this,max_duplicate_filenames,ec);
      goto LAB_00735593;
    }
    index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
    operator++(&local_a4);
  } while( true );
}

Assistant:

bool torrent_info::resolve_duplicate_filenames(int const max_duplicate_filenames
		, error_code& ec)
	{
		INVARIANT_CHECK;

		std::unordered_set<std::uint32_t> files;

		std::string const empty_str;

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		m_files.all_path_hashes(files);
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const h = m_files.file_path_hash(i, empty_str);
			if (!files.insert(h).second)
			{
				// This filename appears to already exist!
				// If this happens, just start over and do it the slow way,
				// comparing full file names and come up with new names
				return resolve_duplicate_filenames_slow(max_duplicate_filenames, ec);
			}
		}
		return true;
	}